

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling.cpp
# Opt level: O1

int __thiscall ncnn::Pooling::forward(Pooling *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  float fVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  int *piVar8;
  int iVar9;
  void *pvVar10;
  long lVar11;
  void *pvVar12;
  int iVar13;
  ulong uVar14;
  uint _w;
  int iVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  int iVar20;
  ulong uVar21;
  void *pvVar22;
  int kj;
  long lVar23;
  int k;
  ulong uVar24;
  uint uVar25;
  float fVar26;
  Mat bottom_blob_bordered;
  vector<int,_std::allocator<int>_> _space_ofs;
  ulong local_150;
  void *local_140;
  void *local_138;
  int local_124;
  int local_120;
  allocator_type local_119;
  Pooling *local_118;
  void *local_110;
  void *local_108;
  long local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  Mat local_c8;
  void *local_80;
  long local_78;
  void *local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  uVar3 = bottom_blob->c;
  uVar14 = (ulong)uVar3;
  sVar6 = bottom_blob->elemsize;
  local_118 = this;
  if (this->global_pooling == 0) {
    local_c8.elemsize._0_4_ = 0;
    local_c8.elemsize._4_4_ = 0;
    local_c8.elempack = 0;
    local_c8.data = (void *)0x0;
    local_c8.refcount._0_4_ = 0;
    local_c8.refcount._4_4_ = 0;
    local_c8.allocator = (Allocator *)0x0;
    local_c8.dims = 0;
    local_c8.w = 0;
    local_c8.h = 0;
    local_c8.c = 0;
    local_c8.cstep = 0;
    make_padding(this,bottom_blob,&local_c8,opt);
    iVar9 = -100;
    if ((local_c8.data != (void *)0x0) && ((long)local_c8.c * local_c8.cstep != 0)) {
      iVar4 = local_c8.w;
      iVar5 = local_c8.h;
      uVar17 = (long)(local_c8.w - this->kernel_w) / (long)this->stride_w;
      local_d0 = uVar17 & 0xffffffff;
      uVar21 = (long)(local_c8.h - this->kernel_h) / (long)this->stride_h;
      local_e8 = uVar21 & 0xffffffff;
      _w = (int)uVar17 + 1;
      uVar25 = (int)uVar21 + 1;
      local_d8 = (ulong)uVar25;
      Mat::create(top_blob,_w,uVar25,uVar3,sVar6,opt->blob_allocator);
      iVar9 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        uVar17 = (long)this->kernel_h * (long)this->kernel_w;
        std::vector<int,_std::allocator<int>_>::vector(&local_48,uVar17,&local_119);
        if (0 < this->kernel_h) {
          iVar9 = this->kernel_w;
          iVar13 = 0;
          iVar15 = 0;
          iVar16 = 0;
          do {
            if (0 < this->kernel_w) {
              lVar11 = 0;
              do {
                local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar16 + lVar11] = iVar15 + (int)lVar11;
                lVar11 = lVar11 + 1;
                iVar20 = (int)lVar11;
              } while (iVar20 < this->kernel_w);
              iVar16 = iVar16 + iVar20;
              iVar15 = iVar15 + iVar20;
            }
            iVar15 = iVar15 + (iVar4 - iVar9);
            iVar13 = iVar13 + 1;
          } while (iVar13 < this->kernel_h);
        }
        iVar9 = (int)uVar17;
        if (this->pooling_type == 1) {
          if (this->avgpool_count_include_pad == 0) {
            local_120 = 0;
            local_124 = 0;
            if (this->pad_mode == 0) {
              local_120 = (bottom_blob->w - local_c8.w) + this->pad_left + this->pad_right;
              local_124 = (bottom_blob->h - local_c8.h) + this->pad_top + this->pad_bottom;
            }
            if (0 < (int)uVar3) {
              local_50 = (long)(int)_w;
              local_80 = local_c8.data;
              local_70 = top_blob->data;
              local_78 = top_blob->cstep * top_blob->elemsize;
              local_60 = (long)local_118->stride_h;
              local_110 = (void *)(ulong)_w;
              lVar11 = (long)local_c8.w *
                       CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
              local_68 = CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) *
                         local_c8.cstep;
              local_58 = lVar11 * local_60;
              local_f8 = 0;
              do {
                if (-1 < (int)local_e8) {
                  local_138 = (void *)(local_78 * local_f8 + (long)local_70);
                  local_100 = (long)local_118->stride_w;
                  uVar3 = local_118->kernel_h;
                  local_108 = (void *)(local_100 * 4);
                  local_140 = local_80;
                  local_e0 = 0;
                  do {
                    if (-1 < (int)local_d0) {
                      iVar9 = local_118->pad_top;
                      lVar23 = 0;
                      pvVar12 = (void *)0x0;
                      pvVar10 = local_140;
                      do {
                        fVar26 = NAN;
                        if (0 < (int)uVar3) {
                          lVar19 = (long)((local_124 + iVar5) - local_118->pad_bottom);
                          fVar26 = 0.0;
                          uVar17 = 0;
                          iVar13 = 0;
                          pvVar22 = pvVar10;
                          do {
                            lVar1 = uVar17 + local_e0 * local_60;
                            iVar15 = 0x2b;
                            if (iVar9 <= lVar1) {
                              iVar15 = 0;
                              if (lVar19 <= lVar1) {
                                iVar15 = 0x29;
                              }
                              if (lVar1 < lVar19 && 0 < local_118->kernel_w) {
                                uVar21 = 0;
                                do {
                                  iVar16 = 0x2e;
                                  if (((long)local_118->pad_left <= (long)(uVar21 + lVar23)) &&
                                     (iVar16 = 0x2c,
                                     (long)(uVar21 + lVar23) <
                                     (long)((local_120 + iVar4) - local_118->pad_right))) {
                                    fVar26 = fVar26 + *(float *)((long)pvVar22 + uVar21 * 4);
                                    iVar13 = iVar13 + 1;
                                    iVar16 = 0;
                                  }
                                  iVar15 = 0;
                                } while (((iVar16 == 0x2e) || (iVar16 == 0)) &&
                                        (uVar21 = uVar21 + 1, (uint)local_118->kernel_w != uVar21));
                              }
                            }
                            if ((iVar15 != 0x2b) && (iVar15 != 0)) break;
                            uVar17 = uVar17 + 1;
                            pvVar22 = (void *)((long)pvVar22 + lVar11);
                          } while (uVar17 != uVar3);
                          fVar26 = fVar26 / (float)iVar13;
                        }
                        *(float *)((long)local_138 + (long)pvVar12 * 4) = fVar26;
                        pvVar12 = (void *)((long)pvVar12 + 1);
                        pvVar10 = (void *)((long)pvVar10 + (long)local_108);
                        lVar23 = lVar23 + local_100;
                      } while (pvVar12 != local_110);
                    }
                    local_138 = (void *)((long)local_138 + local_50 * 4);
                    local_e0 = local_e0 + 1;
                    local_140 = (void *)((long)local_140 + local_58);
                  } while (local_e0 != local_d8);
                }
                local_f8 = local_f8 + 1;
                local_80 = (void *)((long)local_80 + local_68);
              } while (local_f8 != uVar14);
            }
          }
          else if (0 < (int)uVar3) {
            local_100 = CONCAT44(local_100._4_4_,local_c8.w);
            local_108 = top_blob->data;
            local_110 = (void *)(top_blob->cstep * top_blob->elemsize);
            local_150 = 0;
            do {
              if (-1 < (int)local_e8) {
                pvVar10 = (void *)((long)local_110 * local_150 + (long)local_108);
                iVar4 = local_118->stride_h;
                iVar5 = local_118->stride_w;
                uVar21 = 0;
                do {
                  if (-1 < (int)local_d0) {
                    uVar18 = 0;
                    do {
                      if (iVar9 < 1) {
                        fVar26 = 0.0;
                      }
                      else {
                        fVar26 = 0.0;
                        uVar24 = 0;
                        do {
                          fVar26 = fVar26 + *(float *)((long)local_c8.data +
                                                      (long)local_48.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar24] *
                                                  4 + uVar18 * (long)iVar5 * 4 +
                                                      (long)(iVar4 * local_c8.w * (int)uVar21) *
                                                      CONCAT44(local_c8.elemsize._4_4_,
                                                               (undefined4)local_c8.elemsize) +
                                                      local_c8.cstep *
                                                      CONCAT44(local_c8.elemsize._4_4_,
                                                               (undefined4)local_c8.elemsize) *
                                                      local_150);
                          uVar24 = uVar24 + 1;
                        } while ((uVar17 & 0xffffffff) != uVar24);
                      }
                      *(float *)((long)pvVar10 + uVar18 * 4) = fVar26 * (1.0 / (float)iVar9);
                      uVar18 = uVar18 + 1;
                    } while (uVar18 != _w);
                  }
                  pvVar10 = (void *)((long)pvVar10 + (long)(int)_w * 4);
                  uVar21 = uVar21 + 1;
                } while (uVar21 != local_d8);
              }
              local_150 = local_150 + 1;
            } while (local_150 != uVar14);
          }
        }
        else if ((this->pooling_type == 0) && (0 < (int)uVar3)) {
          local_100 = CONCAT44(local_100._4_4_,local_c8.w);
          local_108 = (void *)(top_blob->cstep * top_blob->elemsize);
          local_110 = top_blob->data;
          local_150 = 0;
          do {
            if (-1 < (int)local_e8) {
              pvVar10 = (void *)((long)local_108 * local_150 + (long)local_110);
              iVar4 = local_118->stride_h;
              iVar5 = local_118->stride_w;
              uVar21 = 0;
              do {
                if (-1 < (int)local_d0) {
                  lVar11 = (long)(iVar4 * local_c8.w * (int)uVar21) *
                           CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) +
                           local_c8.cstep *
                           CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) *
                           local_150;
                  uVar18 = 0;
                  do {
                    lVar23 = uVar18 * (long)iVar5;
                    fVar26 = *(float *)((long)local_c8.data + lVar23 * 4 + lVar11);
                    if (0 < iVar9) {
                      uVar24 = 0;
                      do {
                        fVar2 = *(float *)((long)local_c8.data +
                                          (long)local_48.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start[uVar24] * 4
                                          + lVar23 * 4 + lVar11);
                        if (fVar26 <= fVar2) {
                          fVar26 = fVar2;
                        }
                        uVar24 = uVar24 + 1;
                      } while ((uVar17 & 0xffffffff) != uVar24);
                    }
                    *(float *)((long)pvVar10 + uVar18 * 4) = fVar26;
                    uVar18 = uVar18 + 1;
                  } while (uVar18 != _w);
                }
                pvVar10 = (void *)((long)pvVar10 + (long)(int)_w * 4);
                uVar21 = uVar21 + 1;
              } while (uVar21 != local_d8);
            }
            local_150 = local_150 + 1;
          } while (local_150 != uVar14);
        }
        local_f0 = uVar14;
        if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        iVar9 = 0;
      }
    }
    piVar8 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 == 0) {
        if (local_c8.allocator == (Allocator *)0x0) {
          if (local_c8.data != (void *)0x0) {
            free(local_c8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_c8.allocator + 0x18))();
        }
      }
    }
  }
  else {
    iVar4 = bottom_blob->w;
    iVar5 = bottom_blob->h;
    Mat::create(top_blob,uVar3,sVar6,opt->blob_allocator);
    iVar9 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar25 = iVar5 * iVar4;
      if (local_118->pooling_type == 0) {
        if ((int)uVar3 < 1) {
          return 0;
        }
        pvVar10 = bottom_blob->data;
        lVar11 = bottom_blob->cstep * bottom_blob->elemsize;
        pvVar12 = top_blob->data;
        uVar17 = 0;
        pvVar22 = pvVar10;
        do {
          fVar26 = *(float *)((long)pvVar10 + lVar11 * uVar17);
          if (0 < (int)uVar25) {
            uVar21 = 0;
            do {
              fVar2 = *(float *)((long)pvVar22 + uVar21 * 4);
              if (fVar26 <= fVar2) {
                fVar26 = fVar2;
              }
              uVar21 = uVar21 + 1;
            } while (uVar25 != uVar21);
          }
          *(float *)((long)pvVar12 + uVar17 * 4) = fVar26;
          uVar17 = uVar17 + 1;
          pvVar22 = (void *)((long)pvVar22 + lVar11);
        } while (uVar17 != uVar14);
      }
      else {
        if (local_118->pooling_type != 1) {
          return 0;
        }
        if ((int)uVar3 < 1) {
          return 0;
        }
        pvVar10 = bottom_blob->data;
        sVar6 = bottom_blob->cstep;
        pvVar12 = top_blob->data;
        sVar7 = bottom_blob->elemsize;
        uVar17 = 0;
        do {
          fVar26 = 0.0;
          if (0 < (int)uVar25) {
            uVar21 = 0;
            do {
              fVar26 = fVar26 + *(float *)((long)pvVar10 + uVar21 * 4);
              uVar21 = uVar21 + 1;
            } while (uVar25 != uVar21);
          }
          *(float *)((long)pvVar12 + uVar17 * 4) = fVar26 * (1.0 / (float)(int)uVar25);
          uVar17 = uVar17 + 1;
          pvVar10 = (void *)((long)pvVar10 + sVar6 * sVar7);
        } while (uVar17 != uVar14);
      }
      iVar9 = 0;
    }
  }
  return iVar9;
}

Assistant:

int Pooling::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

//     fprintf(stderr, "Pooling     input %d x %d  pad = %d %d %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_left, pad_right, pad_top, pad_bottom, kernel_w, kernel_h, stride_w, stride_h);
    if (global_pooling)
    {
        top_blob.create(channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int size = w * h;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float max = ptr[0];
                for (int i=0; i<size; i++)
                {
                    max = std::max(max, ptr[i]);
                }

                top_blob[q] = max;
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float sum = 0.f;
                for (int i=0; i<size; i++)
                {
                    sum += ptr[i];
                }

                top_blob[q] = sum / size;
            }
        }

        return 0;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w - kernel_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2++;
            }
            p2 += gap;
        }
    }

    if (pooling_type == PoolMethod_MAX)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    float max = sptr[0];

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        max = std::max(max, val);
                    }

                    outptr[j] = max;
                }

                outptr += outw;
            }
        }
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        if (avgpool_count_include_pad == 0)
        {
            int wtailpad = 0;
            int htailpad = 0;

            if (pad_mode == 0) // full padding
            {
                wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    int sy0 = i * stride_h;

                    for (int j = 0; j < outw; j++)
                    {
                        int sx0 = j * stride_w;

                        float sum = 0;
                        int area = 0;

                        for (int ki = 0; ki < kernel_h; ki++)
                        {
                            int sy = sy0 + ki;

                            if (sy < pad_top)
                                continue;

                            if (sy >= h - pad_bottom - htailpad)
                                break;

                            for (int kj = 0; kj < kernel_w; kj++)
                            {
                                int sx = sx0 + kj;

                                if (sx < pad_left)
                                    continue;

                                if (sx >= w - pad_right - wtailpad)
                                    break;

                                float val = m.row(sy)[sx];
                                sum += val;
                                area += 1;
                            }
                        }

                        outptr[j] = sum / area;
                    }

                    outptr += outw;
                }
            }
        }
        else // if (avgpool_count_include_pad == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i*stride_h) + j*stride_w;

                        float sum = 0;

                        for (int k = 0; k < maxk; k++)
                        {
                            float val = sptr[ space_ofs[k] ];
                            sum += val;
                        }

                        outptr[j] = sum / maxk;
                    }

                    outptr += outw;
                }
            }
        }
    }

    return 0;
}